

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_spec_constants(Compiler *compiler)

{
  FILE *__stream;
  uint32_t uVar1;
  SpecializationConstant *pSVar2;
  SpecializationConstant *c;
  SpecializationConstant *__end1;
  SpecializationConstant *__begin1;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> *__range1;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> spec_constants;
  Compiler *compiler_local;
  
  spec_constants.stack_storage.aligned_char._56_8_ = compiler;
  spirv_cross::Compiler::get_specialization_constants
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)&__range1,compiler);
  fprintf(_stderr,"Specialization constants\n");
  fprintf(_stderr,"==================\n\n");
  __end1 = spirv_cross::VectorView<spirv_cross::SpecializationConstant>::begin
                     ((VectorView<spirv_cross::SpecializationConstant> *)&__range1);
  pSVar2 = spirv_cross::VectorView<spirv_cross::SpecializationConstant>::end
                     ((VectorView<spirv_cross::SpecializationConstant> *)&__range1);
  for (; __stream = _stderr, __end1 != pSVar2; __end1 = __end1 + 1) {
    uVar1 = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    fprintf(__stream,"ID: %u, Spec ID: %u\n",(ulong)uVar1,(ulong)__end1->constant_id);
  }
  fprintf(_stderr,"==================\n\n");
  spirv_cross::SmallVector<spirv_cross::SpecializationConstant,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)&__range1);
  return;
}

Assistant:

static void print_spec_constants(const Compiler &compiler)
{
	auto spec_constants = compiler.get_specialization_constants();
	fprintf(stderr, "Specialization constants\n");
	fprintf(stderr, "==================\n\n");
	for (auto &c : spec_constants)
		fprintf(stderr, "ID: %u, Spec ID: %u\n", uint32_t(c.id), c.constant_id);
	fprintf(stderr, "==================\n\n");
}